

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O2

function_return function_call(function_conflict func,void **args,size_t size)

{
  function_impl_interface_invoke UNRECOVERED_JUMPTABLE;
  function_return pvVar1;
  size_t line;
  char *message;
  
  if (func == (function_conflict)0x0) {
    message = "Invalid function call, function pointer is null";
    line = 0x23a;
  }
  else if (args == (void **)0x0) {
    message = "Invalid function call, arguments are null";
    line = 0x241;
  }
  else if (func->interface == (function_interface)0x0) {
    message = "Invalid function call, function interface is null";
    line = 0x248;
  }
  else {
    UNRECOVERED_JUMPTABLE = func->interface->invoke;
    if (UNRECOVERED_JUMPTABLE != (function_impl_interface_invoke)0x0) {
      pvVar1 = (*UNRECOVERED_JUMPTABLE)(func,func->impl,args,size);
      return pvVar1;
    }
    message = "Invalid function call, function interface invoke method is null";
    line = 0x24f;
  }
  log_write_impl_va("metacall",line,"function_call",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_function.c"
                    ,LOG_LEVEL_ERROR,message);
  return (function_return)0x0;
}

Assistant:

function_return function_call(function func, function_args args, size_t size)
{
	if (func == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function pointer is null");

		return NULL;
	}

	if (args == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, arguments are null");

		return NULL;
	}

	if (func->interface == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function interface is null");

		return NULL;
	}

	if (func->interface->invoke == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid function call, function interface invoke method is null");

		return NULL;
	}

	/*
	#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
		return function_call_debug(func, args, size);
	#else
		return func->interface->invoke(func, func->impl, args, size);
	#endif
	*/

	return func->interface->invoke(func, func->impl, args, size);
}